

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url_dispatcher.h
# Opt level: O3

bool cppcms::url_dispatcher::parse<point>
               (application *app,const_char_istream *p,cmatch *m,int group,point *v)

{
  long lVar1;
  char cVar2;
  ulong uVar3;
  char *pcVar4;
  char *pcVar5;
  long lVar6;
  char *begin;
  ulong uVar7;
  
  if (group < 0) {
    uVar7 = 0;
    cVar2 = cppcms::url_dispatcher::validate_encoding(app,(char *)0x0,(char *)0x0);
    uVar3 = 0;
    if (cVar2 == '\0') goto LAB_0012e1bf;
  }
  else {
    lVar1 = *(long *)(m + 0x10);
    if (group < (int)((ulong)(*(long *)(m + 0x18) - lVar1) >> 3)) {
      lVar6 = (long)*(int *)(lVar1 + (ulong)(uint)group * 8);
      pcVar4 = (char *)0x0;
      pcVar5 = pcVar4;
      if (lVar6 != -1) {
        pcVar4 = (char *)((long)*(int *)(lVar1 + 4 + (ulong)(uint)group * 8) + *(long *)m);
        pcVar5 = (char *)(*(long *)m + lVar6);
      }
    }
    else {
      pcVar4 = (char *)0x0;
      pcVar5 = (char *)0x0;
    }
    cVar2 = cppcms::url_dispatcher::validate_encoding(app,pcVar5,pcVar4);
    if (cVar2 == '\0') {
      uVar7 = 0;
      goto LAB_0012e1bf;
    }
    lVar1 = *(long *)(m + 0x10);
    if (group < (int)((ulong)(*(long *)(m + 0x18) - lVar1) >> 3)) {
      lVar6 = (long)*(int *)(lVar1 + (ulong)(uint)group * 8);
      uVar3 = 0;
      uVar7 = uVar3;
      if (lVar6 != -1) {
        uVar3 = (long)*(int *)(lVar1 + 4 + (ulong)(uint)group * 8) + *(long *)m;
        uVar7 = *(long *)m + lVar6;
      }
    }
    else {
      uVar3 = 0;
      uVar7 = 0;
    }
  }
  *(ulong *)&(p->super_istream).field_0x18 = uVar7;
  *(ulong *)&(p->super_istream).field_0x20 = uVar7;
  *(ulong *)&(p->super_istream).field_0x28 = uVar3;
  std::ios::clear((int)(p->super_istream)._vptr_basic_istream[-3] + (int)p);
  operator>>(&p->super_istream,v);
  uVar7 = (ulong)((*(uint *)(&(p->super_istream).field_0x20 +
                            (long)(p->super_istream)._vptr_basic_istream[-3]) & 7) == 2);
LAB_0012e1bf:
  return SUB81(uVar7,0);
}

Assistant:

static bool parse(application &app,util::const_char_istream &p,booster::cmatch const &m,int group,T &v)
		{
			if(!validate_encoding(app,m[group].first,m[group].second))
				return false;
			p.range(m[group].first,m[group].second);
			return parse_url_parameter(p,v);
		}